

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Surface.cpp
# Opt level: O0

void __thiscall myvk::Surface::~Surface(Surface *this)

{
  PFN_vkDestroySurfaceKHR p_Var1;
  element_type *this_00;
  VkInstance pVVar2;
  undefined8 *in_RDI;
  
  *in_RDI = &PTR__Surface_0052fef8;
  p_Var1 = vkDestroySurfaceKHR;
  if (in_RDI[6] != 0) {
    this_00 = std::__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
              operator->((__shared_ptr_access<myvk::Instance,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)0x297105);
    pVVar2 = Instance::GetHandle(this_00);
    (*p_Var1)(pVVar2,(VkSurfaceKHR)in_RDI[6],(VkAllocationCallbacks *)0x0);
  }
  std::shared_ptr<myvk::Instance>::~shared_ptr((shared_ptr<myvk::Instance> *)0x29713f);
  Base::~Base((Base *)0x297149);
  return;
}

Assistant:

Surface::~Surface() {
	if (m_surface)
		vkDestroySurfaceKHR(m_instance_ptr->GetHandle(), m_surface, nullptr);
}